

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O0

TValue * lj_tab_setinth(lua_State *L,GCtab *t,int32_t key)

{
  uint uVar1;
  uint uVar2;
  TValue *pTVar3;
  int in_EDX;
  long in_RSI;
  double dVar4;
  Node *n;
  TValue k;
  Node *n_1;
  TValue *local_50;
  uint local_48;
  int iStackY_44;
  cTValue *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  
  dVar4 = (double)in_EDX;
  local_48 = SUB84(dVar4,0);
  iStackY_44 = (int)((ulong)dVar4 >> 0x20);
  uVar1 = iStackY_44 << 0xf | (uint)(iStackY_44 << 1) >> 0x12;
  uVar2 = (iStackY_44 << 1 ^ local_48) - uVar1;
  uVar1 = (uVar2 ^ (uVar1 << 5 | (uint)(iStackY_44 << 0xf) >> 0x1b)) -
          (uVar2 * 0x2000 | uVar2 >> 0x13);
  local_50 = (TValue *)
             (&((GCtab *)(ulong)*(uint *)(in_RSI + 0x14))->nextgc +
             (ulong)(uVar1 & *(uint *)(in_RSI + 0x1c)) * 6);
  do {
    if (((GCRef *)((long)local_50 + 0xc))->gcptr32 < 0xfffeffff) {
      if ((local_50[1].n == dVar4) && (!NAN(local_50[1].n) && !NAN(dVar4))) {
        return local_50;
      }
    }
    local_50 = (TValue *)(ulong)local_50[2].u32.lo;
    if (local_50 == (TValue *)0x0) {
      pTVar3 = lj_tab_newkey((lua_State *)CONCAT44(uVar1,in_stack_ffffffffffffffe8),
                             (GCtab *)(ulong)*(uint *)(in_RSI + 0x14),in_stack_ffffffffffffffd8);
      return pTVar3;
    }
  } while( true );
}

Assistant:

TValue *lj_tab_setinth(lua_State *L, GCtab *t, int32_t key)
{
  TValue k;
  Node *n;
  k.n = (lua_Number)key;
  n = hashnum(t, &k);
  do {
    if (tvisnum(&n->key) && n->key.n == k.n)
      return &n->val;
  } while ((n = nextnode(n)));
  return lj_tab_newkey(L, t, &k);
}